

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

bool __thiscall
helics::TimeCoordinator::transmitTimingMessages
          (TimeCoordinator *this,ActionMessage *msg,GlobalFederateId skipFed)

{
  bool bVar1;
  action_t aVar2;
  reference pDVar3;
  BaseType in_EDX;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  bool skipped;
  undefined4 in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffac;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_30;
  GlobalFederateId *local_28;
  byte local_19;
  ActionMessage *local_18;
  GlobalFederateId local_4;
  
  local_19 = 0;
  local_28 = &in_RDI->source_id;
  local_18 = in_RSI;
  local_4.gid = in_EDX;
  local_30._M_current =
       (DependencyInfo *)
       TimeDependencies::begin
                 ((TimeDependencies *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  TimeDependencies::end
            ((TimeDependencies *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                           ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pDVar3 = __gnu_cxx::
             __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator*(&local_30);
    if ((pDVar3->dependent & 1U) != 0) {
      bVar1 = GlobalFederateId::operator==(&pDVar3->fedID,local_4);
      if (bVar1) {
        local_19 = 1;
      }
      else {
        (local_18->dest_id).gid = (pDVar3->fedID).gid;
        aVar2 = ActionMessage::action(local_18);
        if ((aVar2 == cmd_exec_request) ||
           (aVar2 = ActionMessage::action(local_18), aVar2 == cmd_time_request)) {
          ActionMessage::setExtraDestData(in_RDI,in_stack_ffffffffffffffac);
        }
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,
                   (ActionMessage *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
    }
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(&local_30);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool TimeCoordinator::transmitTimingMessages(ActionMessage& msg, GlobalFederateId skipFed) const
{
    bool skipped{false};
    for (const auto& dep : dependencies) {
        if (dep.dependent) {
            if (dep.fedID == skipFed) {
                skipped = true;
                continue;
            }
            msg.dest_id = dep.fedID;
            if (msg.action() == CMD_EXEC_REQUEST || msg.action() == CMD_TIME_REQUEST) {
                msg.setExtraDestData(dep.sequenceCounter);
            }
            sendMessageFunction(msg);
        }
    }
    return skipped;
}